

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astIfNode_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,
          sysbvm_tuple_t conditionExpression,sysbvm_tuple_t trueExpression,
          sysbvm_tuple_t falseExpression)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_astIfNode_t *result;
  sysbvm_tuple_t falseExpression_local;
  sysbvm_tuple_t trueExpression_local;
  sysbvm_tuple_t conditionExpression_local;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).astIfNodeType,6);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].field_1.pointers[0] = conditionExpression;
  psVar1[2].header.field_0.typePointer = trueExpression;
  psVar1[2].header.identityHashAndFlags = (int)falseExpression;
  psVar1[2].header.objectSize = (int)(falseExpression >> 0x20);
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astIfNode_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t conditionExpression, sysbvm_tuple_t trueExpression, sysbvm_tuple_t falseExpression)
{
    sysbvm_astIfNode_t *result = (sysbvm_astIfNode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.astIfNodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_astIfNode_t));
    result->super.sourcePosition = sourcePosition;
    result->conditionExpression = conditionExpression;
    result->trueExpression = trueExpression;
    result->falseExpression = falseExpression;
    return (sysbvm_tuple_t)result;
}